

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O0

void __thiscall Memory::HeapInfo::EnterIdleDecommit(HeapInfo *this)

{
  HeapInfo *this_local;
  
  ForEachPageAllocator<Memory::HeapInfo::EnterIdleDecommit()::__0>(this);
  return;
}

Assistant:

void
HeapInfo::EnterIdleDecommit()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->EnterIdleDecommit();
    });
}